

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::PumpSink>::
AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&,kj::AsyncOutputStream&,unsigned_long&>
          (AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::PumpSink> *this,
          Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *params,AsyncOutputStream *params_1,
          unsigned_long *params_2)

{
  Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *registration;
  AsyncOutputStream *output;
  unsigned_long *puVar1;
  unsigned_long *params_local_2;
  AsyncOutputStream *params_local_1;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *params_local;
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::PumpSink> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<unsigned_long>::PromiseFulfiller
            ((PromiseFulfiller<unsigned_long> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_007dbcd8;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_007dbd20;
  ExceptionOr<unsigned_long>::ExceptionOr((ExceptionOr<unsigned_long> *)(this + 0x18));
  this[0x188] = (AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::PumpSink>)0x1
  ;
  registration = fwd<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&>(params);
  output = fwd<kj::AsyncOutputStream&>(params_1);
  puVar1 = fwd<unsigned_long&>(params_2);
  anon_unknown_77::AsyncTee::PumpSink::PumpSink
            ((PumpSink *)(this + 400),(PromiseFulfiller<unsigned_int> *)(this + 0x10),registration,
             output,*puVar1);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}